

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuImageCompare.cpp
# Opt level: O2

void tcu::anon_unknown_50::computeScaleAndBias
               (ConstPixelBufferAccess *reference,ConstPixelBufferAccess *result,Vec4 *scale,
               Vec4 *bias)

{
  float fVar1;
  uint uVar2;
  long lVar3;
  float fVar4;
  float fVar5;
  Vec4 minVal;
  Vec4 refMax;
  Vec4 refMin;
  Vec4 maxVal;
  Vector<float,_4> local_88;
  ConstPixelBufferAccess *local_70;
  Vector<float,_4> local_68;
  Vector<float,_4> local_58;
  Vector<float,_4> local_48;
  
  local_70 = result;
  Vector<float,_4>::Vector(&local_88);
  Vector<float,_4>::Vector(&local_48);
  Vector<float,_4>::Vector(&local_58);
  Vector<float,_4>::Vector(&local_68);
  estimatePixelValueRange(reference,&local_58,&local_68);
  local_88.m_data[0] = local_58.m_data[0];
  local_88.m_data[1] = local_58.m_data[1];
  local_88.m_data[2] = local_58.m_data[2];
  local_88.m_data[3] = local_58.m_data[3];
  local_48.m_data[0] = local_68.m_data[0];
  local_48.m_data[1] = local_68.m_data[1];
  local_48.m_data[2] = local_68.m_data[2];
  local_48.m_data[3] = local_68.m_data[3];
  Vector<float,_4>::Vector(&local_58);
  Vector<float,_4>::Vector(&local_68);
  estimatePixelValueRange(local_70,&local_58,&local_68);
  local_88.m_data[1] =
       (float)(~-(uint)(local_88.m_data[1] <= local_58.m_data[1]) & (uint)local_58.m_data[1] |
              (uint)local_88.m_data[1] & -(uint)(local_88.m_data[1] <= local_58.m_data[1]));
  local_88.m_data[0] =
       (float)(~-(uint)(local_88.m_data[0] <= local_58.m_data[0]) & (uint)local_58.m_data[0] |
              (uint)local_88.m_data[0] & -(uint)(local_88.m_data[0] <= local_58.m_data[0]));
  local_88.m_data[3] =
       (float)(~-(uint)(local_88.m_data[3] <= local_58.m_data[3]) & (uint)local_58.m_data[3] |
              (uint)local_88.m_data[3] & -(uint)(local_88.m_data[3] <= local_58.m_data[3]));
  local_88.m_data[2] =
       (float)(~-(uint)(local_88.m_data[2] <= local_58.m_data[2]) & (uint)local_58.m_data[2] |
              (uint)local_88.m_data[2] & -(uint)(local_88.m_data[2] <= local_58.m_data[2]));
  local_48.m_data[3] =
       (float)(~-(uint)(local_68.m_data[3] <= local_48.m_data[3]) & (uint)local_68.m_data[3] |
              (uint)local_48.m_data[3] & -(uint)(local_68.m_data[3] <= local_48.m_data[3]));
  uVar2 = (uint)DAT_00235680;
  local_48.m_data[1] =
       (float)(~-(uint)(local_68.m_data[1] <= local_48.m_data[1]) & (uint)local_68.m_data[1] |
              (uint)local_48.m_data[1] & -(uint)(local_68.m_data[1] <= local_48.m_data[1]));
  local_48.m_data[0] =
       (float)(~-(uint)(local_68.m_data[0] <= local_48.m_data[0]) & (uint)local_68.m_data[0] |
              (uint)local_48.m_data[0] & -(uint)(local_68.m_data[0] <= local_48.m_data[0]));
  local_48.m_data[2] =
       (float)(~-(uint)(local_68.m_data[2] <= local_48.m_data[2]) & (uint)local_68.m_data[2] |
              (uint)local_48.m_data[2] & -(uint)(local_68.m_data[2] <= local_48.m_data[2]));
  lVar3 = 0;
  do {
    if (lVar3 == 0x10) {
      return;
    }
    fVar4 = *(float *)((long)local_48.m_data + lVar3);
    fVar1 = *(float *)((long)local_88.m_data + lVar3);
    fVar5 = fVar4 - fVar1;
    if (0.0001 <= fVar5) {
      fVar5 = 1.0 / fVar5;
      *(float *)((long)scale->m_data + lVar3) = fVar5;
LAB_001e4bcc:
      fVar4 = 0.0 - fVar1 * fVar5;
    }
    else {
      fVar5 = (float)(~-(uint)(fVar4 < 0.0001) & (uint)(1.0 / fVar4) |
                     -(uint)(fVar4 < 0.0001) & 0x3f800000);
      *(float *)((long)scale->m_data + lVar3) = fVar5;
      if (lVar3 != 0xc) goto LAB_001e4bcc;
      fVar4 = scale->m_data[3] * (float)((uint)local_48.m_data[3] ^ uVar2) + 1.0;
    }
    *(float *)((long)bias->m_data + lVar3) = fVar4;
    lVar3 = lVar3 + 4;
  } while( true );
}

Assistant:

void computeScaleAndBias (const ConstPixelBufferAccess& reference, const ConstPixelBufferAccess& result, tcu::Vec4& scale, tcu::Vec4& bias)
{
	Vec4 minVal;
	Vec4 maxVal;
	const float eps = 0.0001f;

	{
		Vec4 refMin;
		Vec4 refMax;
		estimatePixelValueRange(reference, refMin, refMax);

		minVal	= refMin;
		maxVal	= refMax;
	}

	{
		Vec4 resMin;
		Vec4 resMax;

		estimatePixelValueRange(result, resMin, resMax);

		minVal[0] = de::min(minVal[0], resMin[0]);
		minVal[1] = de::min(minVal[1], resMin[1]);
		minVal[2] = de::min(minVal[2], resMin[2]);
		minVal[3] = de::min(minVal[3], resMin[3]);

		maxVal[0] = de::max(maxVal[0], resMax[0]);
		maxVal[1] = de::max(maxVal[1], resMax[1]);
		maxVal[2] = de::max(maxVal[2], resMax[2]);
		maxVal[3] = de::max(maxVal[3], resMax[3]);
	}

	for (int c = 0; c < 4; c++)
	{
		if (maxVal[c] - minVal[c] < eps)
		{
			scale[c]	= (maxVal[c] < eps) ? 1.0f : (1.0f / maxVal[c]);
			bias[c]		= (c == 3) ? (1.0f - maxVal[c]*scale[c]) : (0.0f - minVal[c]*scale[c]);
		}
		else
		{
			scale[c]	= 1.0f / (maxVal[c] - minVal[c]);
			bias[c]		= 0.0f - minVal[c]*scale[c];
		}
	}
}